

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int btreeMoveto(BtCursor *pCur,void *pKey,i64 nKey,int bias,int *pRes)

{
  KeyInfo *pKeyInfo;
  int iVar1;
  UnpackedRecord *p;
  
  if (pKey == (void *)0x0) {
    p = (UnpackedRecord *)0x0;
  }
  else {
    pKeyInfo = pCur->pKeyInfo;
    p = sqlite3VdbeAllocUnpackedRecord(pKeyInfo);
    if (p == (UnpackedRecord *)0x0) {
      return 7;
    }
    sqlite3VdbeRecordUnpack(pKeyInfo,(int)nKey,pKey,p);
    if ((p->nField == 0) || (pKeyInfo->nAllField < p->nField)) {
      iVar1 = sqlite3CorruptError(0xfa42);
      goto LAB_0016eeda;
    }
  }
  iVar1 = sqlite3BtreeMovetoUnpacked(pCur,p,nKey,bias,pRes);
  if (p == (UnpackedRecord *)0x0) {
    return iVar1;
  }
LAB_0016eeda:
  sqlite3DbFreeNN(pCur->pKeyInfo->db,p);
  return iVar1;
}

Assistant:

static int btreeMoveto(
  BtCursor *pCur,     /* Cursor open on the btree to be searched */
  const void *pKey,   /* Packed key if the btree is an index */
  i64 nKey,           /* Integer key for tables.  Size of pKey for indices */
  int bias,           /* Bias search to the high end */
  int *pRes           /* Write search results here */
){
  int rc;                    /* Status code */
  UnpackedRecord *pIdxKey;   /* Unpacked index key */

  if( pKey ){
    KeyInfo *pKeyInfo = pCur->pKeyInfo;
    assert( nKey==(i64)(int)nKey );
    pIdxKey = sqlite3VdbeAllocUnpackedRecord(pKeyInfo);
    if( pIdxKey==0 ) return SQLITE_NOMEM_BKPT;
    sqlite3VdbeRecordUnpack(pKeyInfo, (int)nKey, pKey, pIdxKey);
    if( pIdxKey->nField==0 || pIdxKey->nField>pKeyInfo->nAllField ){
      rc = SQLITE_CORRUPT_BKPT;
      goto moveto_done;
    }
  }else{
    pIdxKey = 0;
  }
  rc = sqlite3BtreeMovetoUnpacked(pCur, pIdxKey, nKey, bias, pRes);
moveto_done:
  if( pIdxKey ){
    sqlite3DbFree(pCur->pKeyInfo->db, pIdxKey);
  }
  return rc;
}